

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool rm(upb_table *t,lookupkey_t key,upb_value *val,uint32_t hash,eqlfunc_t *eql)

{
  upb_key uVar1;
  _upb_tabent *p_Var2;
  _Bool _Var3;
  upb_tabent *move;
  upb_tabent *rm;
  _upb_tabent *p_Var4;
  upb_tabent *puVar5;
  uint uVar6;
  
  uVar6 = hash & t->mask;
  uVar1 = t->entries[uVar6].key;
  if (uVar1.num == 0) {
LAB_0040ba8e:
    _Var3 = false;
  }
  else {
    p_Var4 = t->entries + uVar6;
    _Var3 = (*eql)(uVar1,key);
    if (_Var3) {
      t->count = t->count - 1;
      if (val != (upb_value *)0x0) {
        val->val = (p_Var4->val).val;
      }
      p_Var2 = p_Var4->next;
      if (p_Var2 == (_upb_tabent *)0x0) {
        (p_Var4->key).num = 0;
      }
      else {
        p_Var4->next = p_Var2->next;
        uVar1 = p_Var2->key;
        (p_Var4->val).val = (p_Var2->val).val;
        p_Var4->key = uVar1;
        (p_Var2->key).num = 0;
      }
    }
    else {
      do {
        puVar5 = p_Var4;
        if (puVar5->next == (_upb_tabent *)0x0) goto LAB_0040ba8e;
        _Var3 = (*eql)(puVar5->next->key,key);
        p_Var4 = puVar5->next;
      } while (!_Var3);
      if (p_Var4 == (_upb_tabent *)0x0) goto LAB_0040ba8e;
      t->count = t->count - 1;
      if (val != (upb_value *)0x0) {
        val->val = (p_Var4->val).val;
      }
      (p_Var4->key).num = 0;
      puVar5->next = p_Var4->next;
    }
    _Var3 = true;
  }
  return _Var3;
}

Assistant:

static bool rm(upb_table* t, lookupkey_t key, upb_value* val, uint32_t hash,
               eqlfunc_t* eql) {
  upb_tabent* chain = getentry_mutable(t, hash);
  if (upb_tabent_isempty(chain)) return false;
  if (eql(chain->key, key)) {
    /* Element to remove is at the head of its chain. */
    t->count--;
    if (val) *val = chain->val;
    if (chain->next) {
      upb_tabent* move = (upb_tabent*)chain->next;
      *chain = *move;
      move->key = upb_key_empty();
    } else {
      chain->key = upb_key_empty();
    }
    return true;
  } else {
    /* Element to remove is either in a non-head position or not in the
     * table. */
    while (chain->next && !eql(chain->next->key, key)) {
      chain = (upb_tabent*)chain->next;
    }
    if (chain->next) {
      /* Found element to remove. */
      upb_tabent* rm = (upb_tabent*)chain->next;
      t->count--;
      if (val) *val = chain->next->val;
      rm->key = upb_key_empty();
      chain->next = rm->next;
      return true;
    } else {
      /* Element to remove is not in the table. */
      return false;
    }
  }
}